

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddTestCommand.cxx
# Opt level: O2

bool cmAddTestCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmTest *pcVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  uint uVar7;
  string *psVar8;
  cmAlphaNum *this;
  ulong uVar9;
  cmAlphaNum local_130;
  __uniq_ptr_impl<cmTestGenerator,_std::default_delete<cmTestGenerator>_> local_100;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_1;
  cmTest *test;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  cmTest *test_1;
  pointer local_58;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__lhs != __last._M_current) {
    bVar4 = std::operator==(__lhs,"NAME");
    if (bVar4) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&command.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar4 = false;
      command.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      command_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      command_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      command_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar7 = 0;
      for (uVar9 = 1;
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar9 = (ulong)((int)uVar9 + 1)) {
        bVar5 = std::operator==(pbVar1 + uVar9,"COMMAND");
        bVar3 = bVar4;
        if (bVar5) {
          uVar7 = 1;
          if (command_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              command_1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130," may be given at most one COMMAND.",
                       (allocator<char> *)&test_1);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            goto LAB_002be729;
          }
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                  "CONFIGURATIONS");
          if (bVar5) {
            uVar7 = 2;
            if (configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_130," may be given at most one set of CONFIGURATIONS.",
                         (allocator<char> *)&test_1);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_002be729;
            }
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                    "WORKING_DIRECTORY");
            if (bVar5) {
              uVar7 = 3;
              if (command.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_130," may be given at most one WORKING_DIRECTORY.",
                           (allocator<char> *)&test_1);
                std::__cxx11::string::_M_assign((string *)&status->Error);
                goto LAB_002be729;
              }
            }
            else {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar9,
                                      "COMMAND_EXPAND_LISTS");
              if (bVar5) {
                uVar7 = 4;
                bVar3 = true;
                if (bVar4) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_130," may be given at most one COMMAND_EXPAND_LISTS.",
                             (allocator<char> *)&test_1);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_002be729;
                }
              }
              else {
                if (3 < uVar7) {
                  local_130.View_._M_len = (size_t)&DAT_0000001b;
                  local_130.View_._M_str = " given unknown argument:\n  ";
                  pbVar1 = (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_58 = (pointer)pbVar1[uVar9]._M_dataplus._M_p;
                  test_1 = (cmTest *)pbVar1[uVar9]._M_string_length;
                  cmStrCat<char[2]>((string *)&test,&local_130,(cmAlphaNum *)&test_1,
                                    (char (*) [2])0x64a205);
                  std::__cxx11::string::_M_assign((string *)&status->Error);
                  goto LAB_002be4d0;
                }
                psVar8 = &name;
                switch(uVar7) {
                case 1:
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&command_1,
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9);
                  uVar7 = 1;
                  break;
                case 2:
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&configurations,
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar9);
                  uVar7 = 2;
                  break;
                case 3:
                  psVar8 = (string *)&command;
                case 0:
                  std::__cxx11::string::_M_assign((string *)psVar8);
                  uVar7 = 4;
                }
              }
            }
          }
        }
        bVar4 = bVar3;
      }
      if (name._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130," must be given non-empty NAME.",(allocator<char> *)&test_1)
        ;
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002be729:
        this = &local_130;
      }
      else {
        if (command_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            command_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130," must be given non-empty COMMAND.",
                     (allocator<char> *)&test_1);
          std::__cxx11::string::_M_assign((string *)&status->Error);
          goto LAB_002be729;
        }
        pcVar2 = status->Makefile;
        pcVar6 = cmMakefile::GetTest(pcVar2,&name);
        if (pcVar6 == (cmTest *)0x0) {
          pcVar6 = cmMakefile::CreateTest(pcVar2,&name);
          pcVar6->OldStyle = false;
          test_1 = pcVar6;
          cmTest::SetCommand(pcVar6,&command_1);
          if (command.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_130,"WORKING_DIRECTORY",(allocator<char> *)&test);
            cmTest::SetProperty(pcVar6,(string *)&local_130,(string *)&command);
            std::__cxx11::string::~string((string *)&local_130);
          }
          cmTest::SetCommandExpandLists(pcVar6,bVar4);
          std::
          make_unique<cmTestGenerator,cmTest*&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                    ((cmTest **)&local_130,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&test_1);
          cmMakefile::AddTestGenerator
                    (pcVar2,(unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                            &local_130);
          if ((long *)local_130.View_._M_len != (long *)0x0) {
            (**(code **)(*(long *)local_130.View_._M_len + 8))();
          }
          local_130.View_._M_len = 0;
          bVar4 = true;
          goto LAB_002be735;
        }
        local_130.View_._M_len = 0x12;
        local_130.View_._M_str = " given test NAME \"";
        test_1 = (cmTest *)name._M_string_length;
        local_58 = (pointer)name._M_dataplus._M_p;
        cmStrCat<char[42]>((string *)&test,&local_130,(cmAlphaNum *)&test_1,
                           (char (*) [42])"\" which already exists in this directory.");
        std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_002be4d0:
        this = (cmAlphaNum *)&test;
      }
      std::__cxx11::string::~string((string *)this);
      bVar4 = false;
LAB_002be735:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&command_1);
      std::__cxx11::string::~string((string *)&command);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&configurations);
      std::__cxx11::string::~string((string *)&name);
      return bVar4;
    }
    __lhs = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((ulong)((long)__last._M_current - (long)__lhs) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"called with incorrect number of arguments",
               (allocator<char> *)&test_1);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_130);
    return false;
  }
  pcVar2 = status->Makefile;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,__lhs + 1
             ,__last,(allocator_type *)&local_130);
  test = cmMakefile::GetTest(pcVar2,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start);
  if (test == (cmTest *)0x0) {
    test = cmMakefile::CreateTest
                     (pcVar2,(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
    test->OldStyle = true;
    std::make_unique<cmTestGenerator,cmTest*&>((cmTest **)&local_100);
    cmMakefile::AddTestGenerator
              (pcVar2,(unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_> *)
                      &local_100);
    if (local_100._M_t.
        super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
        super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>)0x0) {
      (**(code **)(*(long *)local_100._M_t.
                            super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>
                            .super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl + 8))();
    }
    local_100._M_t.super__Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>.
    super__Head_base<0UL,_cmTestGenerator_*,_false>._M_head_impl =
         (tuple<cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>)
         (_Tuple_impl<0UL,_cmTestGenerator_*,_std::default_delete<cmTestGenerator>_>)0x0;
  }
  else if (test->OldStyle == false) {
    local_130.View_._M_len = 0x12;
    local_130.View_._M_str = " given test name \"";
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_58 = (pointer)(pbVar1->_M_dataplus)._M_p;
    test_1 = (cmTest *)pbVar1->_M_string_length;
    cmStrCat<char[42]>(&name,&local_130,(cmAlphaNum *)&test_1,
                       (char (*) [42])"\" which already exists in this directory.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&name);
    bVar4 = false;
    goto LAB_002be53e;
  }
  bVar4 = true;
  cmTest::SetCommand(test,&command);
LAB_002be53e:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  return bVar4;
}

Assistant:

bool cmAddTestCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (!args.empty() && args[0] == "NAME") {
    return cmAddTestCommandHandleNameMode(args, status);
  }

  // First argument is the name of the test Second argument is the name of
  // the executable to run (a target or external program) Remaining arguments
  // are the arguments to pass to the executable
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Collect the command with arguments.
  std::vector<std::string> command(args.begin() + 1, args.end());

  // Create the test but add a generator only the first time it is
  // seen.  This preserves behavior from before test generators.
  cmTest* test = mf.GetTest(args[0]);
  if (test) {
    // If the test was already added by a new-style signature do not
    // allow it to be duplicated.
    if (!test->GetOldStyle()) {
      status.SetError(cmStrCat(" given test name \"", args[0],
                               "\" which already exists in this directory."));
      return false;
    }
  } else {
    test = mf.CreateTest(args[0]);
    test->SetOldStyle(true);
    mf.AddTestGenerator(cm::make_unique<cmTestGenerator>(test));
  }
  test->SetCommand(command);

  return true;
}